

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcMemberType::~IfcMemberType(IfcMemberType *this)

{
  ~IfcMemberType((IfcMemberType *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcMemberType() : Object("IfcMemberType") {}